

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O3

bool __thiscall
cmDependsFortran::Finalize(cmDependsFortran *this,ostream *makeDepends,ostream *internalDepends)

{
  cmMakefile *this_00;
  pointer pcVar1;
  cmDependsFortranInternals *pcVar2;
  size_type sVar3;
  char *pcVar4;
  _Base_ptr p_Var5;
  ostream *poVar6;
  _Rb_tree_header *p_Var7;
  string fiName;
  string fcName;
  string mod_lower;
  string mod_dir;
  string mod_upper;
  string currentBinDir;
  string stamp;
  cmGeneratedFileStream fiStream;
  cmGeneratedFileStream fcStream;
  string local_5d0;
  long *local_5b0 [2];
  long local_5a0 [2];
  long *local_590 [2];
  long local_580 [2];
  string local_570;
  _Base_ptr local_550;
  pointer local_548;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  undefined1 local_4c0 [584];
  cmGeneratedFileStream local_278;
  
  LocateModules(this);
  local_548 = (this->super_cmDepends).TargetDirectory._M_dataplus._M_p;
  this_00 = ((this->super_cmDepends).LocalGenerator)->Makefile;
  local_4c0._0_8_ = local_4c0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4c0,"CMAKE_Fortran_TARGET_MODULE_DIR","");
  pcVar4 = cmMakefile::GetSafeDefinition(this_00,(string *)local_4c0);
  std::__cxx11::string::string((string *)&local_540,pcVar4,(allocator *)&local_278);
  if ((undefined1 *)local_4c0._0_8_ != local_4c0 + 0x10) {
    operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
  }
  if ((char *)local_540._M_string_length == (char *)0x0) {
    pcVar4 = cmLocalGenerator::GetCurrentBinaryDirectory((this->super_cmDepends).LocalGenerator);
    sVar3 = local_540._M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)&local_540,0,(char *)sVar3,(ulong)pcVar4);
  }
  p_Var5 = (this->Internal->ObjectInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(this->Internal->ObjectInfo)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var7) {
    do {
      WriteDependenciesReal
                (this,*(char **)(p_Var5 + 1),(cmFortranSourceInfo *)(p_Var5 + 2),&local_540,
                 local_548,makeDepends,internalDepends);
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var7);
  }
  local_5b0[0] = local_5a0;
  pcVar1 = (this->super_cmDepends).TargetDirectory._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_5b0,pcVar1,
             pcVar1 + (this->super_cmDepends).TargetDirectory._M_string_length);
  std::__cxx11::string::append((char *)local_5b0);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_4c0,(char *)local_5b0[0],false,None);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4c0,"# The fortran modules provided by this target.\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"provides\n",9);
  pcVar2 = this->Internal;
  p_Var5 = (pcVar2->TargetProvides)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_550 = &(pcVar2->TargetProvides)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var5 != local_550) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0," ",1);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_4c0,*(char **)(p_Var5 + 1),(long)p_Var5[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != local_550);
  }
  if ((pcVar2->TargetProvides)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_590[0] = local_580;
    pcVar1 = (this->super_cmDepends).TargetDirectory._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_590,pcVar1,
               pcVar1 + (this->super_cmDepends).TargetDirectory._M_string_length);
    std::__cxx11::string::append((char *)local_590);
    cmGeneratedFileStream::cmGeneratedFileStream(&local_278,(char *)local_590[0],false,None);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_278,"# Remove fortran modules provided by this target.\n",0x32);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"FILE(REMOVE",0xb);
    pcVar4 = cmLocalGenerator::GetCurrentBinaryDirectory((this->super_cmDepends).LocalGenerator);
    std::__cxx11::string::string((string *)&local_500,pcVar4,(allocator *)&local_520);
    p_Var5 = (pcVar2->TargetProvides)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (p_Var5 != local_550) {
      do {
        local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_520,local_540._M_dataplus._M_p,
                   (char *)(local_540._M_string_length + (long)local_540._M_dataplus._M_p));
        std::__cxx11::string::append((char *)&local_520);
        cmsys::SystemTools::UpperCase(&local_570,(string *)(p_Var5 + 1));
        std::__cxx11::string::_M_append((char *)&local_520,(ulong)local_570._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_570._M_dataplus._M_p != &local_570.field_2) {
          operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)&local_520);
        local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_570,local_540._M_dataplus._M_p,
                   (char *)(local_540._M_string_length + (long)local_540._M_dataplus._M_p));
        std::__cxx11::string::append((char *)&local_570);
        std::__cxx11::string::_M_append((char *)&local_570,*(ulong *)(p_Var5 + 1));
        std::__cxx11::string::append((char *)&local_570);
        std::__cxx11::string::string((string *)&local_4e0,local_548,(allocator *)&local_5d0);
        std::__cxx11::string::append((char *)&local_4e0);
        std::__cxx11::string::_M_append((char *)&local_4e0,*(ulong *)(p_Var5 + 1));
        std::__cxx11::string::append((char *)&local_4e0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"  \"",3);
        MaybeConvertToRelativePath(&local_5d0,this,&local_500,&local_570);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_278,local_5d0._M_dataplus._M_p,
                            local_5d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
          operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"  \"",3);
        MaybeConvertToRelativePath(&local_5d0,this,&local_500,&local_520);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_278,local_5d0._M_dataplus._M_p,
                            local_5d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
          operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"  \"",3);
        MaybeConvertToRelativePath(&local_5d0,this,&local_500,&local_4e0);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_278,local_5d0._M_dataplus._M_p,
                            local_5d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
          operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
          operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_570._M_dataplus._M_p != &local_570.field_2) {
          operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_520._M_dataplus._M_p != &local_520.field_2) {
          operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while (p_Var5 != local_550);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"  )\n",4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_500._M_dataplus._M_p != &local_500.field_2) {
      operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&local_278);
    if (local_590[0] != local_580) {
      operator_delete(local_590[0],local_580[0] + 1);
    }
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_4c0);
  if (local_5b0[0] != local_5a0) {
    operator_delete(local_5b0[0],local_5a0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540._M_dataplus._M_p != &local_540.field_2) {
    operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool cmDependsFortran::Finalize(std::ostream& makeDepends,
                                std::ostream& internalDepends)
{
  // Prepare the module search process.
  this->LocateModules();

  // Get the directory in which stamp files will be stored.
  const char* stamp_dir = this->TargetDirectory.c_str();

  // Get the directory in which module files will be created.
  cmMakefile* mf = this->LocalGenerator->GetMakefile();
  std::string mod_dir =
    mf->GetSafeDefinition("CMAKE_Fortran_TARGET_MODULE_DIR");
  if (mod_dir.empty()) {
    mod_dir = this->LocalGenerator->GetCurrentBinaryDirectory();
  }

  // Actually write dependencies to the streams.
  typedef cmDependsFortranInternals::ObjectInfoMap ObjectInfoMap;
  ObjectInfoMap const& objInfo = this->Internal->ObjectInfo;
  for (ObjectInfoMap::const_iterator i = objInfo.begin(); i != objInfo.end();
       ++i) {
    if (!this->WriteDependenciesReal(i->first.c_str(), i->second, mod_dir,
                                     stamp_dir, makeDepends,
                                     internalDepends)) {
      return false;
    }
  }

  // Store the list of modules provided by this target.
  std::string fiName = this->TargetDirectory;
  fiName += "/fortran.internal";
  cmGeneratedFileStream fiStream(fiName.c_str());
  fiStream << "# The fortran modules provided by this target.\n";
  fiStream << "provides\n";
  std::set<std::string> const& provides = this->Internal->TargetProvides;
  for (std::set<std::string>::const_iterator i = provides.begin();
       i != provides.end(); ++i) {
    fiStream << " " << *i << "\n";
  }

  // Create a script to clean the modules.
  if (!provides.empty()) {
    std::string fcName = this->TargetDirectory;
    fcName += "/cmake_clean_Fortran.cmake";
    cmGeneratedFileStream fcStream(fcName.c_str());
    fcStream << "# Remove fortran modules provided by this target.\n";
    fcStream << "FILE(REMOVE";
    std::string currentBinDir =
      this->LocalGenerator->GetCurrentBinaryDirectory();
    for (std::set<std::string>::const_iterator i = provides.begin();
         i != provides.end(); ++i) {
      std::string mod_upper = mod_dir;
      mod_upper += "/";
      mod_upper += cmSystemTools::UpperCase(*i);
      mod_upper += ".mod";
      std::string mod_lower = mod_dir;
      mod_lower += "/";
      mod_lower += *i;
      mod_lower += ".mod";
      std::string stamp = stamp_dir;
      stamp += "/";
      stamp += *i;
      stamp += ".mod.stamp";
      fcStream << "\n";
      fcStream << "  \""
               << this->MaybeConvertToRelativePath(currentBinDir, mod_lower)
               << "\"\n";
      fcStream << "  \""
               << this->MaybeConvertToRelativePath(currentBinDir, mod_upper)
               << "\"\n";
      fcStream << "  \""
               << this->MaybeConvertToRelativePath(currentBinDir, stamp)
               << "\"\n";
    }
    fcStream << "  )\n";
  }
  return true;
}